

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,BrotliEncoderParams *params,
               ContextType literal_context_mode,Command_conflict *commands,size_t n_commands,
               MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  HuffmanTree *tree_00;
  Command_conflict *pCVar8;
  ulong uVar9;
  size_t context_1;
  uint64_t distextra;
  uint32_t distnumextra;
  size_t dist_code;
  uint8_t literal;
  size_t context;
  size_t j_1;
  size_t j;
  size_t cmd_code;
  Command_conflict cmd;
  BrotliDistanceParams *dist;
  BlockEncoder distance_enc;
  BlockEncoder command_enc;
  BlockEncoder literal_enc;
  ContextLut literal_context_lut;
  HuffmanTree *tree;
  uint32_t num_effective_distance_symbols;
  uint32_t num_distance_symbols;
  size_t i;
  size_t pos;
  uint8_t prev_byte_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t bits;
  uint64_t copyextraval;
  uint64_t insextraval;
  uint32_t insnumextra;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t copylen_code;
  uint64_t v_3;
  uint8_t *p_3;
  uint32_t c;
  uint32_t r;
  uint local_c4;
  int32_t delta;
  uint32_t modifier;
  uint32_t nbits;
  ushort local_4a;
  uint32_t nbits_1;
  ushort local_22;
  
  uVar6 = (params->dist).alphabet_size;
  tree._0_4_ = uVar6;
  if ((params->large_window != 0) && (0x220 < uVar6)) {
    tree._0_4_ = 0x220;
  }
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree_00 = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  InitBlockEncoder((BlockEncoder *)&command_enc.bits_,0x100,(mb->literal_split).num_types,
                   (mb->literal_split).types,(mb->literal_split).lengths,
                   (mb->literal_split).num_blocks);
  InitBlockEncoder((BlockEncoder *)&distance_enc.bits_,0x2c0,(mb->command_split).num_types,
                   (mb->command_split).types,(mb->command_split).lengths,
                   (mb->command_split).num_blocks);
  InitBlockEncoder((BlockEncoder *)&dist,(ulong)(uint)tree,(mb->distance_split).num_types,
                   (mb->distance_split).types,(mb->distance_split).lengths,
                   (mb->distance_split).num_blocks);
  BuildAndStoreBlockSwitchEntropyCodes
            ((BlockEncoder *)&command_enc.bits_,tree_00,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes
            ((BlockEncoder *)&distance_enc.bits_,tree_00,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes((BlockEncoder *)&dist,tree_00,storage_ix,storage);
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)(params->dist).distance_postfix_bits << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)((params->dist).num_direct_distance_codes >>
              ((byte)(params->dist).distance_postfix_bits & 0x1f)) << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 4;
  for (_num_effective_distance_symbols = 0;
      _num_effective_distance_symbols < (mb->literal_split).num_types;
      _num_effective_distance_symbols = _num_effective_distance_symbols + 1) {
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)literal_context_mode << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 2;
  }
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,6,tree_00,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree_00,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,2,tree_00,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree_00,storage_ix,storage);
  }
  BuildAndStoreEntropyCodesLiteral
            (m,(BlockEncoder *)&command_enc.bits_,mb->literal_histograms,mb->literal_histograms_size
             ,0x100,tree_00,storage_ix,storage);
  BuildAndStoreEntropyCodesCommand
            (m,(BlockEncoder *)&distance_enc.bits_,mb->command_histograms,
             mb->command_histograms_size,0x2c0,tree_00,storage_ix,storage);
  BuildAndStoreEntropyCodesDistance
            (m,(BlockEncoder *)&dist,mb->distance_histograms,mb->distance_histograms_size,
             (ulong)uVar6,tree_00,storage_ix,storage);
  BrotliFree(m,tree_00);
  i = start_pos;
  pos._7_1_ = prev_byte;
  for (_num_effective_distance_symbols = 0; _num_effective_distance_symbols < n_commands;
      _num_effective_distance_symbols = _num_effective_distance_symbols + 1) {
    pCVar8 = commands + _num_effective_distance_symbols;
    uVar4._0_4_ = pCVar8->insert_len_;
    uVar4._4_4_ = pCVar8->copy_len_;
    uVar5._0_4_ = pCVar8->dist_extra_;
    uVar5._4_2_ = pCVar8->cmd_prefix_;
    uVar5._6_2_ = pCVar8->dist_prefix_;
    StoreSymbol((BlockEncoder *)&distance_enc.bits_,uVar5 >> 0x20 & 0xffff,storage_ix,storage);
    uVar6 = (uVar4._4_4_ & 0x1ffffff) +
            (int)(char)((byte)((uint)uVar4._4_4_ >> 0x19) |
                       (byte)(((uint)uVar4._4_4_ >> 0x19 & 0x40) << 1));
    uVar9 = uVar4 & 0xffffffff;
    if (uVar9 < 6) {
      local_4a = (ushort)(undefined4)uVar4;
    }
    else if (uVar9 < 0x82) {
      iVar7 = 0x1f;
      if ((undefined4)uVar4 - 2 != 0) {
        for (; (undefined4)uVar4 - 2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      local_4a = (short)(iVar7 + -1) * 2 + (short)(uVar9 - 2 >> ((byte)(iVar7 + -1) & 0x3f)) + 2;
    }
    else if (uVar9 < 0x842) {
      iVar7 = 0x1f;
      if ((undefined4)uVar4 - 0x42 != 0) {
        for (; (undefined4)uVar4 - 0x42 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      local_4a = (short)iVar7 + 10;
    }
    else if (uVar9 < 0x1842) {
      local_4a = 0x15;
    }
    else if (uVar9 < 0x5842) {
      local_4a = 0x16;
    }
    else {
      local_4a = 0x17;
    }
    uVar9 = (ulong)uVar6;
    if (uVar9 < 10) {
      local_22 = (short)uVar6 - 2;
    }
    else if (uVar9 < 0x86) {
      iVar7 = 0x1f;
      if (uVar6 - 6 != 0) {
        for (; uVar6 - 6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      local_22 = (short)(iVar7 + -1) * 2 + (short)(uVar9 - 6 >> ((byte)(iVar7 + -1) & 0x3f)) + 4;
    }
    else if (uVar9 < 0x846) {
      iVar7 = 0x1f;
      if (uVar6 - 0x46 != 0) {
        for (; uVar6 - 0x46 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      local_22 = (short)iVar7 + 0xc;
    }
    else {
      local_22 = 0x17;
    }
    uVar2 = kInsExtra[local_4a];
    uVar3 = kCopyExtra[local_22];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         ((ulong)(uVar6 - kCopyBase[local_22]) << ((byte)uVar2 & 0x3f) |
         (ulong)((undefined4)uVar4 - kInsBase[local_4a])) << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)(uVar2 + uVar3) + *storage_ix;
    if (mb->literal_context_map_size == 0) {
      for (j_1 = uVar4 & 0xffffffff; j_1 != 0; j_1 = j_1 - 1) {
        StoreSymbol((BlockEncoder *)&command_enc.bits_,(ulong)input[i & mask],storage_ix,storage);
        i = i + 1;
      }
    }
    else {
      for (context = uVar4 & 0xffffffff; context != 0; context = context - 1) {
        bVar1 = input[i & mask];
        StoreSymbolWithContext
                  ((BlockEncoder *)&command_enc.bits_,(ulong)bVar1,
                   (long)(int)(uint)(""[(ulong)pos._7_1_ + (ulong)(literal_context_mode << 9)] |
                                    ""[(ulong)prev_byte2 +
                                       (ulong)(literal_context_mode << 9) + 0x100]),
                   mb->literal_context_map,storage_ix,storage,6);
        prev_byte2 = pos._7_1_;
        i = i + 1;
        pos._7_1_ = bVar1;
      }
    }
    i = (uVar4._4_4_ & 0x1ffffff) + i;
    if ((uVar4 & 0x1ffffff00000000) != 0) {
      prev_byte2 = input[i - 2 & mask];
      pos._7_1_ = input[i - 1 & mask];
      if (0x7f < (ushort)uVar5._4_2_) {
        if (mb->distance_context_map_size == 0) {
          StoreSymbol((BlockEncoder *)&dist,(long)(int)((ushort)uVar5._6_2_ & 0x3ff),storage_ix,
                      storage);
        }
        else {
          iVar7 = (int)(uint)(ushort)uVar5._4_2_ >> 6;
          local_c4 = (ushort)uVar5._4_2_ & 7;
          if (((((iVar7 != 0) && (iVar7 != 2)) && (iVar7 != 4)) && (iVar7 != 7)) || (2 < local_c4))
          {
            local_c4 = 3;
          }
          StoreSymbolWithContext
                    ((BlockEncoder *)&dist,(long)(int)((ushort)uVar5._6_2_ & 0x3ff),(ulong)local_c4,
                     mb->distance_context_map,storage_ix,storage,2);
        }
        *(ulong *)(storage + (*storage_ix >> 3)) =
             (uVar5 & 0xffffffff) << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = (ulong)(uint)((int)(uint)(ushort)uVar5._6_2_ >> 10) + *storage_ix;
      }
    }
  }
  CleanupBlockEncoder(m,(BlockEncoder *)&dist);
  CleanupBlockEncoder(m,(BlockEncoder *)&distance_enc.bits_);
  CleanupBlockEncoder(m,(BlockEncoder *)&command_enc.bits_);
  if (is_last != 0) {
    JumpToByteBoundary(storage_ix,storage);
  }
  return;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    uint8_t prev_byte, uint8_t prev_byte2, BROTLI_BOOL is_last,
    const BrotliEncoderParams* params, ContextType literal_context_mode,
    const Command* commands, size_t n_commands, const MetaBlockSplit* mb,
    size_t* storage_ix, uint8_t* storage) {

  size_t pos = start_pos;
  size_t i;
  uint32_t num_distance_symbols = params->dist.alphabet_size;
  uint32_t num_effective_distance_symbols = num_distance_symbols;
  HuffmanTree* tree;
  ContextLut literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  const BrotliDistanceParams* dist = &params->dist;
  if (params->large_window &&
      num_effective_distance_symbols > BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS) {
    num_effective_distance_symbols = BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS;
  }

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, BROTLI_NUM_LITERAL_SYMBOLS,
      mb->literal_split.num_types, mb->literal_split.types,
      mb->literal_split.lengths, mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_effective_distance_symbols,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, dist->distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(
      4, dist->num_direct_distance_codes >> dist->distance_postfix_bits,
      storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, BROTLI_NUM_LITERAL_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, BROTLI_NUM_COMMAND_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, num_distance_symbols, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context =
            BROTLI_CONTEXT(prev_byte, prev_byte2, literal_context_lut);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_ & 0x3FF;
        uint32_t distnumextra = cmd.dist_prefix_ >> 10;
        uint64_t distextra = cmd.dist_extra_;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}